

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void * lua_touserdata(lua_State *L,int idx)

{
  TValue *pTVar1;
  cTValue *o;
  int idx_local;
  lua_State *L_local;
  uint32_t *segmap;
  uint64_t seg;
  uint64_t u;
  
  pTVar1 = index2adr(L,idx);
  if ((int)(pTVar1->field_4).it >> 0xf == -0xd) {
    L_local = (lua_State *)((pTVar1->u64 & 0x7fffffffffff) + 0x30);
  }
  else if ((int)(pTVar1->field_4).it >> 0xf == -4) {
    L_local = (lua_State *)
              ((ulong)*(uint *)(*(long *)((L->glref).ptr64 + 0x70) +
                               (pTVar1->u64 >> 0x27 & 0xff) * 4) << 0x20 |
              pTVar1->u64 & 0x7fffffffff);
  }
  else {
    L_local = (lua_State *)0x0;
  }
  return L_local;
}

Assistant:

LUA_API void *lua_touserdata(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  if (tvisudata(o))
    return uddata(udataV(o));
  else if (tvislightud(o))
    return lightudV(G(L), o);
  else
    return NULL;
}